

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_GammaCorrection(GammaCorrectionForm1 GammaCorrection)

{
  byte bVar1;
  uint uVar2;
  code *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  uint8_t corrected;
  double value;
  Image output;
  double gamma;
  double a;
  Image input;
  uint8_t intensity;
  uint8_t in_stack_ffffffffffffff1f;
  undefined4 in_stack_ffffffffffffff20;
  ushort uVar6;
  uint8_t in_stack_ffffffffffffff26;
  uint8_t in_stack_ffffffffffffff27;
  undefined8 in_stack_ffffffffffffff28;
  double dVar7;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar8;
  uint32_t height;
  uint32_t in_stack_ffffffffffffff48;
  uint8_t in_stack_ffffffffffffff4f;
  undefined1 local_a8 [40];
  double local_80;
  double local_78;
  undefined1 local_60 [40];
  undefined1 local_38 [47];
  byte local_9;
  code *local_8;
  
  auVar5 = in_ZMM0._0_16_;
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  uVar2 = (uint)local_9;
  height = (uint32_t)((ulong)local_60 >> 0x20);
  uVar8 = 0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff27,in_stack_ffffffffffffff26
            );
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48,height,
             (Image *)CONCAT44(uVar8,uVar2));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5b75);
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d5b7f);
  auVar5 = vcvtusi2sd_avx512f(auVar5,uVar2);
  auVar4._0_8_ = auVar5._0_8_ / 100.0;
  auVar4._8_8_ = auVar5._8_8_;
  local_78 = auVar4._0_8_;
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d5bab);
  auVar5 = vcvtusi2sd_avx512f(auVar4,uVar2);
  local_80 = auVar5._0_8_ / 100.0;
  (*local_8)(local_78,local_80,local_a8,local_38);
  dVar7 = local_78;
  dVar3 = pow((double)local_9 / 255.0,local_80);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar7 * dVar3;
  auVar5 = vfmadd213sd_fma(ZEXT816(0x406fe00000000000),auVar5,ZEXT816(0x3fe0000000000000));
  if (256.0 <= auVar5._0_8_) {
    uVar6 = 0xff;
  }
  else {
    uVar6 = (ushort)(int)auVar5._0_8_ & 0xff;
  }
  bVar1 = Unit_Test::verifyImage
                    ((Image *)(ulong)CONCAT24(uVar6,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1f);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5c9b);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5ca8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_GammaCorrection(GammaCorrectionForm1 GammaCorrection)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double a     = randomValue <uint32_t>( 100 ) / 100.0;
        const double gamma = randomValue <uint32_t>( 300 ) / 100.0;

        const PenguinV_Image::Image output = GammaCorrection( input, a, gamma );

        const double value = a * pow( intensity / 255.0, gamma ) * 255 + 0.5;
        const uint8_t corrected = (value < 256) ? static_cast<uint8_t>(value) : 255;

        return verifyImage( output, corrected );
    }